

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_obj.cpp
# Opt level: O2

Mtbdd __thiscall
sylvan::Mtbdd::Permute
          (Mtbdd *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *from,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *to)

{
  uint32_t key;
  Mtbdd *pMVar1;
  MTBDD MVar2;
  long *in_RCX;
  long lVar3;
  ulong uVar4;
  MtbddMap map;
  MtbddMap local_58;
  Mtbdd local_50;
  Bdd local_48;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_40;
  Mtbdd *local_38;
  
  local_40 = from;
  local_38 = this;
  MtbddMap::MtbddMap(&local_58);
  uVar4 = (ulong)(*(long *)(to + 8) - *(long *)to) >> 2 & 0xffffffff;
  while( true ) {
    uVar4 = uVar4 - 1;
    if ((int)(uint)uVar4 < 0) break;
    lVar3 = (ulong)((uint)uVar4 & 0x7fffffff) * 4;
    key = *(uint32_t *)(*(long *)to + lVar3);
    Bdd::bddVar(&local_48,*(uint32_t *)(*in_RCX + lVar3));
    local_50.mtbdd = local_48.bdd;
    mtbdd_protect(&local_50.mtbdd);
    local_58.mtbdd = mtbdd_map_add(local_58.mtbdd,key,local_50.mtbdd);
    ~Mtbdd(&local_50);
    Bdd::~Bdd(&local_48);
  }
  MVar2 = mtbdd_compose_RUN(*(MTBDD *)local_40,local_58.mtbdd);
  pMVar1 = local_38;
  local_38->mtbdd = MVar2;
  mtbdd_protect(&local_38->mtbdd);
  MtbddMap::~MtbddMap(&local_58);
  return (Mtbdd)(MTBDD)pMVar1;
}

Assistant:

Mtbdd
Mtbdd::Permute(const std::vector<uint32_t>& from, const std::vector<uint32_t>& to) const
{
    /* Create a map */
    MtbddMap map;
    for (int i=from.size()-1; i>=0; i--) {
        map.put(from[i], Bdd::bddVar(to[i]));
    }

    return mtbdd_compose(mtbdd, map.mtbdd);
}